

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O1

WriteDescriptorResult __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::DeferredThirdPartyClient::writeDescriptor
          (DeferredThirdPartyClient *this,Builder descriptor,Vector<int> *fds)

{
  int iVar1;
  ClientHook *extraout_RDX;
  WriteDescriptorResult WVar3;
  ClientHook *pCVar2;
  
  iVar1 = *(int *)&fds[2].builder.ptr;
  if (iVar1 == 2) {
    WVar3 = RpcConnectionState::writeDescriptor
                      ((RpcConnectionState *)this,(ClientHook *)fds[1].builder.pos,descriptor,
                       (Vector<int> *)fds[2].builder.endPtr);
    pCVar2 = WVar3.described;
  }
  else {
    if (iVar1 != 1) {
      kj::_::unreachable();
    }
    (**(code **)(*(long *)fds[3].builder.ptr + 0x48))(this);
    pCVar2 = extraout_RDX;
  }
  WVar3.described = pCVar2;
  WVar3.exportId.ptr = (NullableValue<unsigned_int>)this;
  return WVar3;
}

Assistant:

WriteDescriptorResult writeDescriptor(rpc::CapDescriptor::Builder descriptor,
                                          kj::Vector<int>& fds) override {
      KJ_SWITCH_ONEOF(state) {
        KJ_CASE_ONEOF(deferred, Deferred) {
          // A ThirdPartyCapDescriptor was sent to us, and we are sending it *back* over the same
          // connection we received it from.
          //
          // The easiest way to handle this is to send back the vine, which after all points to
          // the capability that the other side originally sent us.
          return deferred.vine->writeDescriptor(descriptor, fds);
        }
        KJ_CASE_ONEOF(cap, kj::Own<ClientHook>) {
          return connectionState->writeDescriptor(*cap, descriptor, fds);
        }
      }
      KJ_UNREACHABLE;
    }